

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_check_privkey(mbedtls_rsa_context *ctx)

{
  int iVar1;
  undefined8 in_RDI;
  mbedtls_mpi *in_stack_00000010;
  mbedtls_mpi *in_stack_00000018;
  mbedtls_mpi *in_stack_00000020;
  mbedtls_mpi *in_stack_00000028;
  mbedtls_mpi *in_stack_00000030;
  void *in_stack_00000040;
  mbedtls_rsa_context *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mbedtls_rsa_check_pubkey(in_stack_ffffffffffffffe8);
  if ((iVar1 != 0) ||
     (iVar1 = rsa_check_context((mbedtls_rsa_context *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (int)((ulong)in_RDI >> 0x20),(int)in_RDI), iVar1 != 0)) {
    return -0x4200;
  }
  iVar1 = mbedtls_rsa_validate_params
                    (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                     in_stack_00000010,(_func_int_void_ptr_uchar_ptr_size_t *)ctx,in_stack_00000040)
  ;
  if (iVar1 != 0) {
    return -0x4200;
  }
  iVar1 = mbedtls_rsa_validate_crt
                    (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                     in_stack_00000010,(mbedtls_mpi *)ctx);
  if (iVar1 != 0) {
    return -0x4200;
  }
  return 0;
}

Assistant:

int mbedtls_rsa_check_privkey(const mbedtls_rsa_context *ctx)
{
    if (mbedtls_rsa_check_pubkey(ctx) != 0 ||
        rsa_check_context(ctx, 1 /* private */, 1 /* blinding */) != 0) {
        return MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    if (mbedtls_rsa_validate_params(&ctx->N, &ctx->P, &ctx->Q,
                                    &ctx->D, &ctx->E, NULL, NULL) != 0) {
        return MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

#if !defined(MBEDTLS_RSA_NO_CRT)
    else if (mbedtls_rsa_validate_crt(&ctx->P, &ctx->Q, &ctx->D,
                                      &ctx->DP, &ctx->DQ, &ctx->QP) != 0) {
        return MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }
#endif

    return 0;
}